

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  uchar *puVar1;
  int iVar2;
  byte *pbVar3;
  mbedtls_asn1_named_data *pmVar4;
  byte *end_00;
  mbedtls_x509_name *pmVar5;
  size_t set_len;
  size_t local_40;
  size_t local_38;
  
LAB_001295dd:
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_40,0x31);
  if (iVar2 != 0) {
    return iVar2 + -0x2380;
  }
  end_00 = *p + local_40;
  pmVar5 = cur;
  do {
    iVar2 = mbedtls_asn1_get_tag(p,end_00,&local_38,0x30);
    if (iVar2 == 0) {
      pbVar3 = *p;
      if (end_00 == pbVar3 || (long)end_00 - (long)pbVar3 < 0) {
        return -0x23e0;
      }
      (pmVar5->oid).tag = (uint)*pbVar3;
      iVar2 = mbedtls_asn1_get_tag(p,end_00,&(pmVar5->oid).len,6);
      if (iVar2 != 0) goto LAB_001296b2;
      puVar1 = *p;
      (pmVar5->oid).p = puVar1;
      pbVar3 = puVar1 + (pmVar5->oid).len;
      *p = pbVar3;
      if (end_00 == pbVar3 || (long)end_00 - (long)pbVar3 < 0) {
        return -0x23e0;
      }
      if (0x1e < *pbVar3) {
        return -0x23e2;
      }
      if ((0x50581008U >> (*pbVar3 & 0x1f) & 1) == 0) {
        return -0x23e2;
      }
      *p = pbVar3 + 1;
      (pmVar5->val).tag = (uint)*pbVar3;
      iVar2 = mbedtls_asn1_get_len(p,end_00,&(pmVar5->val).len);
      if (iVar2 != 0) goto LAB_001296b2;
      puVar1 = *p;
      (pmVar5->val).p = puVar1;
      *p = puVar1 + (pmVar5->val).len;
      pmVar5->next = (mbedtls_asn1_named_data *)0x0;
    }
    else {
LAB_001296b2:
      if (iVar2 + -0x2380 != 0) {
        return iVar2 + -0x2380;
      }
    }
    if (*p == end_00) break;
    pmVar5->next_merged = '\x01';
    pmVar4 = (mbedtls_asn1_named_data *)calloc(1,0x40);
    pmVar5->next = pmVar4;
    pmVar5 = pmVar4;
    if (pmVar4 == (mbedtls_asn1_named_data *)0x0) {
      return -0x2880;
    }
  } while( true );
  if (end_00 == end) {
    return 0;
  }
  cur = (mbedtls_x509_name *)calloc(1,0x40);
  pmVar5->next = cur;
  if (cur == (mbedtls_asn1_named_data *)0x0) {
    return -0x2880;
  }
  goto LAB_001295dd;
}

Assistant:

int mbedtls_x509_get_name( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_name *cur )
{
    int ret;
    size_t set_len;
    const unsigned char *end_set;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while( 1 )
    {
        /*
         * parse SET
         */
        if( ( ret = mbedtls_asn1_get_tag( p, end, &set_len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_NAME + ret );

        end_set  = *p + set_len;

        while( 1 )
        {
            if( ( ret = x509_get_attr_type_value( p, end_set, cur ) ) != 0 )
                return( ret );

            if( *p == end_set )
                break;

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_name ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if( *p == end )
            return( 0 );

        cur->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_name ) );

        if( cur->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        cur = cur->next;
    }
}